

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

e_int32 calc_slot_car(OPLL_SLOT *slot,e_int32 fm)

{
  e_int32 fm_local;
  OPLL_SLOT *slot_local;
  
  if (slot->egout < 0xff) {
    slot->output[0] =
         (int)DB2LIN_TABLE[(uint)slot->sintbl[slot->pgout + fm * 8 & 0x1ff] + slot->egout];
  }
  else {
    slot->output[0] = 0;
  }
  slot->output[1] = slot->output[1] + slot->output[0] >> 1;
  return slot->output[1];
}

Assistant:

INLINE static e_int32
calc_slot_car (OPLL_SLOT * slot, e_int32 fm)
{
  if (slot->egout >= (DB_MUTE - 1))
  {
    slot->output[0] = 0;
  }
  else
  {
    slot->output[0] = DB2LIN_TABLE[slot->sintbl[(slot->pgout+wave2_8pi(fm))&(PG_WIDTH-1)] + slot->egout];
  }

  slot->output[1] = (slot->output[1] + slot->output[0]) >> 1;
  return slot->output[1];
}